

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O1

int netaddr_cmp_to_socket(netaddr *a1,netaddr_socket *a2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = (uint)a1->_type;
  iVar1 = uVar2 - (a2->v4).sin_family;
  if (iVar1 != 0) {
    return iVar1;
  }
  uVar3 = 0;
  if (a1->_type == 10) {
    uVar6 = *(ulong *)a1->_addr;
    uVar4 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    uVar6 = *(ulong *)(a2->v4).sin_zero;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    if (uVar4 == uVar6) {
      uVar6 = *(ulong *)(a1->_addr + 8);
      uVar4 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
      uVar6 = *(ulong *)((long)&(a2->v6).sin6_addr.__in6_u + 8);
      uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
      if (uVar4 == uVar6) goto LAB_001269d7;
    }
    uVar3 = -(uint)(uVar4 < uVar6) | 1;
  }
  else {
    uVar3 = 0;
    if (uVar2 == 2) {
      uVar3 = *(uint *)a1->_addr;
      uVar5 = (a2->v6).sin6_flowinfo;
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar3 = (uint)(uVar3 >= uVar5 && uVar3 != uVar5) - (uint)(uVar3 < uVar5);
    }
  }
LAB_001269d7:
  if (uVar3 != 0) {
    return uVar3;
  }
  iVar1 = a1->_prefix_len - 0x20;
  if (uVar2 != 2) {
    iVar1 = a1->_prefix_len - 0x80;
  }
  return iVar1;
}

Assistant:

int
netaddr_cmp_to_socket(const struct netaddr *a1, const union netaddr_socket *a2) {
  int result = 0;

  result = (int)a1->_type - (int)a2->std.sa_family;
  if (result) {
    return result;
  }

  if (a1->_type == AF_INET) {
    result = memcmp(a1->_addr, &a2->v4.sin_addr, 4);
  }
  else if (a1->_type == AF_INET6) {
    /* ipv6 */
    result = memcmp(a1->_addr, &a2->v6.sin6_addr, 16);
  }

  if (result) {
    return result;
  }

  return (int)a1->_prefix_len - (a1->_type == AF_INET ? 32 : 128);
}